

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall QMdiSubWindow::~QMdiSubWindow(QMdiSubWindow *this)

{
  ~QMdiSubWindow((QMdiSubWindow *)&this[-1].super_QWidget.field_0x18);
  return;
}

Assistant:

QMdiSubWindow::~QMdiSubWindow()
{
    Q_D(QMdiSubWindow);
#if QT_CONFIG(menubar)
    d->removeButtonsFromMenuBar();
#endif
    d->setActive(false);
    delete d->controlContainer;
}